

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SyntaxKind SVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ParamAssignmentSyntax *pPVar6;
  ParameterValueAssignmentSyntax *this;
  undefined4 extraout_var;
  Delay3Control *pDVar8;
  TimingControl *pTVar9;
  Diagnostic *diag;
  ulong index;
  SourceRange sourceRange;
  Expression *delays [3];
  Expression *local_58 [3];
  SourceRange local_40;
  Expression *pEVar7;
  
  sVar5 = (exprs->parameters).elements._M_extent._M_extent_value;
  this = exprs;
  if (sVar5 - 7 < 0xfffffffffffffffa) {
LAB_00741f48:
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&this->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x540007,sourceRange);
  }
  else {
    local_58[0] = (Expression *)0x0;
    local_58[1] = (Expression *)0x0;
    local_58[2] = (Expression *)0x0;
    index = 0;
    while( true ) {
      pEVar7 = local_58[0];
      if (sVar5 + 1 >> 1 <= index) {
        local_40 = slang::syntax::SyntaxNode::sourceRange
                             (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
        pDVar8 = BumpAllocator::
                 emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                           (&compilation->super_BumpAllocator,pEVar7,local_58 + 1,local_58 + 2,
                            &local_40);
        return &pDVar8->super_TimingControl;
      }
      pPVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (&exprs->parameters,index);
      SVar1 = (pPVar6->super_SyntaxNode).kind;
      this = (ParameterValueAssignmentSyntax *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                       (&exprs->parameters,index);
      if (SVar1 != OrderedParamAssignment) goto LAB_00741f48;
      uVar2._0_2_ = (this->hash).kind;
      uVar2._2_1_ = (this->hash).field_0x2;
      uVar2._3_1_ = (this->hash).numFlags;
      uVar2._4_4_ = (this->hash).rawLen;
      iVar4 = Expression::bind((int)uVar2,(sockaddr *)context,0);
      pEVar7 = (Expression *)CONCAT44(extraout_var,iVar4);
      local_58[index] = pEVar7;
      bVar3 = Type::isNumeric((pEVar7->type).ptr);
      if (!bVar3) break;
      index = index + 1;
      sVar5 = (exprs->parameters).elements._M_extent._M_extent_value;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x140008,pEVar7->sourceRange);
    ast::operator<<(diag,(pEVar7->type).ptr);
  }
  pTVar9 = TimingControl::badCtrl(compilation,(TimingControl *)0x0);
  return pTVar9;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    SLANG_ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}